

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_tableref.hpp
# Opt level: O3

BoundColumnDataRef * __thiscall
duckdb::BoundTableRef::Cast<duckdb::BoundColumnDataRef>(BoundTableRef *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == COLUMN_DATA) {
    return (BoundColumnDataRef *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast bound table ref to type - table ref type mismatch",
             "");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast bound table ref to type - table ref type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}